

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O2

void __thiscall solitaire::Solitaire::trySelectNextStockPileCard(Solitaire *this)

{
  long *plVar1;
  bool bVar2;
  pointer *__ptr;
  long *local_10;
  
  bVar2 = shouldSelectNextStockPileCard(this);
  if (bVar2) {
    (*(((this->stockPile).
        super___shared_ptr<solitaire::piles::interfaces::StockPile,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_Archiver)._vptr_Archiver[2])(&local_10);
    (*(((this->stockPile).
        super___shared_ptr<solitaire::piles::interfaces::StockPile,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_Archiver)._vptr_Archiver[4])();
    plVar1 = local_10;
    local_10 = (long *)0x0;
    (*((this->historyTracker)._M_t.
       super___uniq_ptr_impl<solitaire::archivers::interfaces::HistoryTracker,_std::default_delete<solitaire::archivers::interfaces::HistoryTracker>_>
       ._M_t.
       super__Tuple_impl<0UL,_solitaire::archivers::interfaces::HistoryTracker_*,_std::default_delete<solitaire::archivers::interfaces::HistoryTracker>_>
       .super__Head_base<0UL,_solitaire::archivers::interfaces::HistoryTracker_*,_false>.
      _M_head_impl)->_vptr_HistoryTracker[3])();
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    if (local_10 != (long *)0x0) {
      (**(code **)(*local_10 + 8))();
    }
  }
  return;
}

Assistant:

void Solitaire::trySelectNextStockPileCard() {
    if (shouldSelectNextStockPileCard()) {
        auto snapshot = stockPile->createSnapshot();
        stockPile->trySelectNextCard();
        historyTracker->save(std::move(snapshot));
    }
}